

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O0

void __thiscall gl3cts::TransformFeedback::QueryVertexSeparate::draw(QueryVertexSeparate *this)

{
  GLuint in_ESI;
  
  draw((QueryVertexSeparate *)
       ((long)&(this->super_CaptureVertexSeparate)._vptr_CaptureVertexSeparate +
       (long)(this->super_CaptureVertexSeparate)._vptr_CaptureVertexSeparate[-10]),in_ESI);
  return;
}

Assistant:

void gl3cts::TransformFeedback::QueryVertexSeparate::draw(glw::GLuint primitive_case)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.beginQuery(GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN, m_query_object);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginQuery call failed.");

	gl3cts::TransformFeedback::CaptureVertexSeparate::draw(primitive_case);

	gl.endQuery(GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEndQuery call failed.");
}